

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

PRECandidates * __thiscall
GlobOpt::FindBackEdgePRECandidates(GlobOpt *this,BasicBlock *block,JitArenaAllocator *alloc)

{
  code *pcVar1;
  GlobHashBucket *this_00;
  GlobHashTable *pGVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ValueNumber VVar5;
  ValueNumber VVar6;
  JitArenaAllocator *pJVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  undefined4 *puVar9;
  Type_conflict node;
  ValueInfo *this_01;
  StackSym *this_02;
  BasicBlock *pBVar10;
  Instr **ppIVar11;
  Type this_03;
  Sym *local_198;
  code *local_190;
  undefined8 local_188;
  TrackAllocData local_180;
  code *local_158;
  undefined8 local_150;
  TrackAllocData local_148;
  code *local_120;
  undefined8 local_118;
  TrackAllocData local_110;
  Instr *local_e8;
  Instr *local_e0;
  Instr *ldInstr;
  Value *landingPadValue;
  BasicBlock *landingPad;
  Value **pSymStoreFromValue;
  Sym *symStore;
  Value *value;
  PropertySym *propertySym;
  Sym *sym;
  GlobHashBucket *bucket;
  Iterator __iter;
  uint i;
  TrackAllocData local_70;
  BVSparse<Memory::JitArenaAllocator> *local_48;
  PRECandidates *candidates;
  Loop *loop;
  GlobHashTable *valueTable;
  JitArenaAllocator *alloc_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  bool local_9;
  
  loop = (Loop *)(block->globOptData).symToValueMap;
  candidates = (PRECandidates *)block->loop;
  pJVar7 = this->tempAlloc;
  valueTable = (GlobHashTable *)alloc;
  alloc_local = (JitArenaAllocator *)block;
  block_local = (BasicBlock *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&PRECandidates::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
             ,0x1513);
  pJVar7 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar7,&local_70);
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x18,pJVar7,0x4e98c0);
  PRECandidates::PRECandidates((PRECandidates *)pBVar8);
  __iter.current._4_4_ = 0;
  local_48 = pBVar8;
  do {
    if (*(uint *)&loop->headBlock <= __iter.current._4_4_) {
      return (PRECandidates *)local_48;
    }
    _bucket = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetIterator
                        ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *
                         )(&loop->topFunc->m_alloc + (ulong)__iter.current._4_4_ * 2));
LAB_0053ff6b:
    this_local = (GlobOpt *)&bucket;
    if (__iter.list ==
        (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    this_00 = bucket;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       this_00,node);
    if (!bVar3) {
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    local_9 = !bVar3;
    if (local_9) {
      sym = (Sym *)SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)&bucket);
      propertySym = (PropertySym *)sym->m_next;
      bVar3 = Sym::IsPropertySym((Sym *)propertySym);
      if (bVar3) {
        value = (Value *)Sym::AsPropertySym(&propertySym->super_Sym);
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((BVSparse<Memory::JitArenaAllocator> *)
                           alloc_local[1].super_ArenaAllocator.
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                           name,(((PropertySym *)value)->super_Sym).m_id);
        if ((BVar4 != '\0') &&
           (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((BVSparse<Memory::JitArenaAllocator> *)
                               candidates[3].candidatesToProcess[7].head,value[1].valueNumber),
           BVar4 != '\0')) {
          symStore = (Sym *)sym->_vptr_Sym;
          this_01 = ::Value::GetValueInfo((Value *)symStore);
          pSymStoreFromValue = (Value **)ValueInfo::GetSymStore(this_01);
          if (((Sym *)pSymStoreFromValue != (Sym *)0x0) &&
             (bVar3 = Sym::IsStackSym((Sym *)pSymStoreFromValue), bVar3)) {
            this_02 = Sym::AsStackSym((Sym *)pSymStoreFromValue);
            bVar3 = StackSym::IsSingleDef(this_02);
            if (bVar3) {
              pBVar10 = Loop::GetHeadBlock((Loop *)candidates);
              BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                                (pBVar10->upwardExposedUses,*(BVIndex *)(pSymStoreFromValue + 2));
              if (BVar4 != '\0') goto LAB_00540180;
            }
            else {
LAB_00540180:
              landingPad = (BasicBlock *)
                           ValueHashTable<Sym_*,_Value_*>::Get
                                     ((ValueHashTable<Sym_*,_Value_*> *)loop,
                                      *(uint *)(pSymStoreFromValue + 2));
              if (landingPad == (BasicBlock *)0x0) goto LAB_0053ff6b;
              VVar5 = ::Value::GetValueNumber((Value *)landingPad->next);
              VVar6 = ::Value::GetValueNumber((Value *)symStore);
              if (VVar5 != VVar6) goto LAB_0053ff6b;
            }
            landingPadValue = (Value *)candidates[3].candidatesToProcess;
            ldInstr = (Instr *)GlobOptBlockData::FindValue
                                         ((GlobOptBlockData *)
                                          &((BVSparse<Memory::JitArenaAllocator> *)
                                           ((long)landingPadValue + 0xc0))->alloc,(Sym *)value);
            if (ldInstr != (Instr *)0x0) {
              local_e8 = (Instr *)0x0;
              ppIVar11 = JsUtil::
                         BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ::Lookup(this->prePassInstrMap,&value[1].valueNumber,&local_e8);
              pGVar2 = valueTable;
              local_e0 = *ppIVar11;
              if (local_e0 != (Instr *)0x0) {
                if (local_48->alloc == (Type)0x0) {
                  Memory::TrackAllocData::CreateTrackAllocData
                            (&local_110,
                             (type_info *)
                             &SList<HashBucket<Sym*,Value*>*,Memory::JitArenaAllocator,RealCount>::
                              typeinfo,0,0xffffffffffffffff,
                             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x155c);
                  pJVar7 = (JitArenaAllocator *)
                           Memory::
                           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           *)pGVar2,&local_110);
                  local_120 = Memory::JitArenaAllocator::Alloc;
                  local_118 = 0;
                  this_03 = (Type)new<Memory::JitArenaAllocator>(0x18,pJVar7,0x4e98c0);
                  SList<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::SList
                            ((SList<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>
                              *)this_03,(JitArenaAllocator *)valueTable);
                  pGVar2 = valueTable;
                  local_48->alloc = this_03;
                  Memory::TrackAllocData::CreateTrackAllocData
                            (&local_148,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,
                             0,0xffffffffffffffff,
                             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x155d);
                  pJVar7 = (JitArenaAllocator *)
                           Memory::
                           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           *)pGVar2,&local_148);
                  local_158 = Memory::JitArenaAllocator::Alloc;
                  local_150 = 0;
                  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
                           new<Memory::JitArenaAllocator>(0x20,pJVar7,0x4e98c0);
                  BVSparse<Memory::JitArenaAllocator>::BVSparse
                            (pBVar8,(JitArenaAllocator *)valueTable);
                  pGVar2 = valueTable;
                  local_48->head = (Type_conflict)pBVar8;
                  Memory::TrackAllocData::CreateTrackAllocData
                            (&local_180,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,
                             0,0xffffffffffffffff,
                             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x155e);
                  pJVar7 = (JitArenaAllocator *)
                           Memory::
                           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           *)pGVar2,&local_180);
                  local_190 = Memory::JitArenaAllocator::Alloc;
                  local_188 = 0;
                  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
                           new<Memory::JitArenaAllocator>(0x20,pJVar7,0x4e98c0);
                  BVSparse<Memory::JitArenaAllocator>::BVSparse
                            (pBVar8,(JitArenaAllocator *)valueTable);
                  local_48->lastFoundIndex = (Type_conflict)pBVar8;
                }
                local_198 = sym;
                SList<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>::Prepend
                          ((SList<HashBucket<Sym_*,_Value_*>_*,_Memory::JitArenaAllocator,_RealCount>
                            *)local_48->alloc,(HashBucket<Sym_*,_Value_*> **)&local_198);
                BVSparse<Memory::JitArenaAllocator>::Set
                          ((BVSparse<Memory::JitArenaAllocator> *)local_48->head,
                           value[1].valueNumber);
                BVSparse<Memory::JitArenaAllocator>::Set
                          ((BVSparse<Memory::JitArenaAllocator> *)local_48->lastFoundIndex,
                           value[1].valueNumber);
              }
            }
          }
        }
      }
      goto LAB_0053ff6b;
    }
    __iter.current._4_4_ = __iter.current._4_4_ + 1;
  } while( true );
}

Assistant:

PRECandidates * GlobOpt::FindBackEdgePRECandidates(BasicBlock *block, JitArenaAllocator *alloc)
{
    // Iterate over the value table looking for propertySyms which are candidates to
    // pre-load in the landing pad for field PRE

    GlobHashTable *valueTable = block->globOptData.symToValueMap;
    Loop *loop = block->loop;
    PRECandidates *candidates = JitAnew(this->tempAlloc, PRECandidates);

    for (uint i = 0; i < valueTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY(GlobHashBucket, bucket, &valueTable->table[i])
        {
            Sym *sym = bucket.value;

            if (!sym->IsPropertySym())
            {
                continue;
            }

            PropertySym *propertySym = sym->AsPropertySym();

            // Field should be live on the back-edge
            if (!block->globOptData.liveFields->Test(propertySym->m_id))
            {
                continue;
            }

            // Field should be live in the landing pad as well
            if (!loop->landingPad->globOptData.liveFields->Test(propertySym->m_id))
            {
                continue;
            }

            Value *value = bucket.element;
            Sym *symStore = value->GetValueInfo()->GetSymStore();

            if (!symStore || !symStore->IsStackSym())
            {
                continue;
            }

            // Check upwardExposed in case of:
            //  s1 = 0;
            // loop:
            //        = o.x;
            //        foo();
            //    o.x = s1;
            // Can't thrash s1 in loop top.
            if (!symStore->AsStackSym()->IsSingleDef() || loop->GetHeadBlock()->upwardExposedUses->Test(symStore->m_id))
            {
                // If symStore isn't singleDef, we need to make sure it still has the same value.
                // This usually fails if we are not aggressive at transferring values in the prepass.
                Value **pSymStoreFromValue = valueTable->Get(symStore->m_id);

                // Consider: We should be fine if symStore isn't live in landing pad...
                if (!pSymStoreFromValue || (*pSymStoreFromValue)->GetValueNumber() != value->GetValueNumber())
                {
                    continue;
                }
            }

            BasicBlock *landingPad = loop->landingPad;
            Value *landingPadValue = landingPad->globOptData.FindValue(propertySym);

            if (!landingPadValue)
            {
                // Value should be added as initial value or already be there.
                continue;
            }

            IR::Instr * ldInstr = this->prePassInstrMap->Lookup(propertySym->m_id, nullptr);

            if (!ldInstr)
            {
                continue;
            }

            if (!candidates->candidatesList)
            {
                candidates->candidatesList = JitAnew(alloc, PRECandidatesList, alloc);
                candidates->candidatesToProcess = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
                candidates->candidatesBv = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
            }

            candidates->candidatesList->Prepend(&bucket);
            candidates->candidatesToProcess->Set(propertySym->m_id);
            candidates->candidatesBv->Set(propertySym->m_id);

        } NEXT_SLISTBASE_ENTRY;
    }

    return candidates;
}